

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O0

bool __thiscall ForbiddenPointFinder::isOverline(ForbiddenPointFinder *this,int x,int y)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int local_30;
  int nLine;
  int iStack_24;
  bool bOverline;
  int j;
  int i;
  int y_local;
  int x_local;
  ForbiddenPointFinder *this_local;
  
  if (this->cBoard[x + 1][y + 1] == Empty) {
    setStone(this,x,y,Black);
    local_30 = 1;
    iStack_24 = x;
    while ((0 < iStack_24 && (this->cBoard[iStack_24][y + 1] == Black))) {
      local_30 = local_30 + 1;
      iStack_24 = iStack_24 + -1;
    }
    iStack_24 = x + 2;
    while ((iStack_24 < 0x10 && (this->cBoard[iStack_24][y + 1] == Black))) {
      local_30 = local_30 + 1;
      iStack_24 = iStack_24 + 1;
    }
    if (local_30 == 5) {
      setStone(this,x,y,Empty);
      this_local._7_1_ = false;
    }
    else {
      bVar1 = 5 < local_30;
      local_30 = 1;
      iStack_24 = y;
      while ((0 < iStack_24 && (this->cBoard[x + 1][iStack_24] == Black))) {
        local_30 = local_30 + 1;
        iStack_24 = iStack_24 + -1;
      }
      iStack_24 = y + 2;
      while ((iStack_24 < 0x10 && (this->cBoard[x + 1][iStack_24] == Black))) {
        local_30 = local_30 + 1;
        iStack_24 = iStack_24 + 1;
      }
      if (local_30 == 5) {
        setStone(this,x,y,Empty);
        this_local._7_1_ = false;
      }
      else {
        bVar2 = 5 < local_30;
        local_30 = 1;
        nLine = y;
        iStack_24 = x;
        while (0 < iStack_24 && 0 < nLine) {
          if (this->cBoard[iStack_24][nLine] != Black) break;
          local_30 = local_30 + 1;
          nLine = nLine + -1;
          iStack_24 = iStack_24 + -1;
        }
        nLine = y + 2;
        iStack_24 = x + 2;
        while (iStack_24 < 0x10 && nLine < 0x10) {
          if (this->cBoard[iStack_24][nLine] != Black) break;
          local_30 = local_30 + 1;
          nLine = nLine + 1;
          iStack_24 = iStack_24 + 1;
        }
        if (local_30 == 5) {
          setStone(this,x,y,Empty);
          this_local._7_1_ = false;
        }
        else {
          bVar3 = 5 < local_30;
          local_30 = 1;
          nLine = y + 2;
          iStack_24 = x;
          while (0 < iStack_24 && nLine < 0x10) {
            if (this->cBoard[iStack_24][nLine] != Black) break;
            local_30 = local_30 + 1;
            nLine = nLine + 1;
            iStack_24 = iStack_24 + -1;
          }
          nLine = y;
          iStack_24 = x + 2;
          while (iStack_24 < 0x10 && 0 < nLine) {
            if (this->cBoard[iStack_24][nLine] != Black) break;
            local_30 = local_30 + 1;
            nLine = nLine + -1;
            iStack_24 = iStack_24 + 1;
          }
          if (local_30 == 5) {
            setStone(this,x,y,Empty);
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = ((bVar1 || bVar2) || bVar3) || 5 < local_30;
            setStone(this,x,y,Empty);
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ForbiddenPointFinder::isOverline(int x, int y) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    setStone(x, y, Stone::Black);

    // detect black overline
    int i, j;
    bool bOverline = false;

    // 1 - horizontal direction
    int nLine = 1;
    i = x;
    while (i > 0) {
        if (cBoard[i--][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[i++][y + 1] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 2 - vertical direction
    nLine = 1;
    i = y;
    while (i > 0) {
        if (cBoard[x + 1][i--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = y + 2;
    while (i < (BoardSize + 1)) {
        if (cBoard[x + 1][i++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 3 - diagonal direction (lower-left to upper-right: '/')
    nLine = 1;
    i = x;
    j = y;
    while ((i > 0) && (j > 0)) {
        if (cBoard[i--][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y + 2;
    while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
        if (cBoard[i++][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    // 4 - diagonal direction (upper-left to lower-right: '\')
    nLine = 1;
    i = x;
    j = y + 2;
    while ((i > 0) && (j < (BoardSize + 1))) {
        if (cBoard[i--][j++] == Stone::Black)
            nLine++;
        else
            break;
    }
    i = x + 2;
    j = y;
    while ((i < (BoardSize + 1)) && (j > 0)) {
        if (cBoard[i++][j--] == Stone::Black)
            nLine++;
        else
            break;
    }
    if (nLine == 5) {
        setStone(x, y, Stone::Empty);
        return false;
    } else
        bOverline |= (nLine >= 6);

    setStone(x, y, Stone::Empty);
    return bOverline;
}